

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

int __thiscall tcmalloc::SizeMap::NumMoveSize(SizeMap *this,size_t size)

{
  undefined1 auVar1 [16];
  int num;
  size_t size_local;
  SizeMap *this_local;
  undefined4 local_4;
  
  if (size == 0) {
    local_4 = 0;
  }
  else {
    auVar1._8_4_ = (int)(size >> 0x20);
    auVar1._0_8_ = size;
    auVar1._12_4_ = 0x45300000;
    num = (int)(65536.0 /
               ((auVar1._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)size) - 4503599627370496.0)));
    if (num < 2) {
      num = 2;
    }
    if (FLAGS_tcmalloc_transfer_num_objects < num) {
      num = FLAGS_tcmalloc_transfer_num_objects;
    }
    local_4 = num;
  }
  return local_4;
}

Assistant:

int SizeMap::NumMoveSize(size_t size) {
  if (size == 0) return 0;
  // Use approx 64k transfers between thread and central caches.
  int num = static_cast<int>(64.0 * 1024.0 / size);
  if (num < 2) num = 2;

  // Avoid bringing too many objects into small object free lists.
  // If this value is too large:
  // - We waste memory with extra objects sitting in the thread caches.
  // - The central freelist holds its lock for too long while
  //   building a linked list of objects, slowing down the allocations
  //   of other threads.
  // If this value is too small:
  // - We go to the central freelist too often and we have to acquire
  //   its lock each time.
  // This value strikes a balance between the constraints above.
  if (num > FLAGS_tcmalloc_transfer_num_objects)
    num = FLAGS_tcmalloc_transfer_num_objects;

  return num;
}